

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O1

void __thiscall bsplib::Rdma::ActionBuf::deserialize(ActionBuf *this,A2A *a2a)

{
  uint *puVar1;
  pointer pAVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int pid;
  long lVar6;
  uint pid_00;
  size_type __new_size;
  uint kind;
  uint dummy;
  uint local_48;
  uint local_44;
  ActionBuf *local_40;
  long local_38;
  
  this->m_dummy_bsmp = 1;
  if (a2a->m_nprocs < 1) {
    __new_size = 0;
  }
  else {
    lVar3 = 0;
    lVar6 = 0;
    __new_size = 0;
    do {
      pid = (int)lVar6;
      deserial<unsigned_int>(a2a,pid,&local_44);
      deserial<unsigned_long>
                (a2a,pid,(unsigned_long *)
                         ((long)(this->m_get_buffer_offset).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar3));
      deserial<unsigned_long>
                (a2a,pid,(unsigned_long *)
                         ((long)(this->m_counts).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar3));
      __new_size = __new_size +
                   *(long *)((long)(this->m_counts).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar3);
      this->m_dummy_bsmp = (uint)(local_44 != 0 && this->m_dummy_bsmp != 0);
      lVar6 = lVar6 + 1;
      lVar3 = lVar3 + 8;
    } while (lVar6 < a2a->m_nprocs);
  }
  std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::resize
            (&this->m_actions,__new_size);
  if (a2a->m_nprocs < 1) {
    lVar3 = 0;
  }
  else {
    lVar6 = 0;
    lVar3 = 0;
    local_40 = this;
    do {
      if ((this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start[lVar6] != 0) {
        lVar4 = lVar3 * 0x38;
        uVar5 = 0;
        local_38 = lVar3;
        do {
          pAVar2 = (local_40->m_actions).
                   super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar1 = (uint *)((long)&pAVar2->kind + lVar4);
          pid_00 = (uint)lVar6;
          puVar1[1] = pid_00;
          deserial<unsigned_int>(a2a,pid_00,&local_48);
          *puVar1 = local_48;
          deserial<int>(a2a,pid_00,(int *)(puVar1 + 2));
          deserial<int>(a2a,pid_00,(int *)((long)&pAVar2->dst_pid + lVar4));
          deserial<int>(a2a,pid_00,(int *)((long)&pAVar2->tag + lVar4));
          deserial<unsigned_long>(a2a,pid_00,(unsigned_long *)((long)&pAVar2->src_slot + lVar4));
          deserial<unsigned_long>(a2a,pid_00,(unsigned_long *)((long)&pAVar2->dst_slot + lVar4));
          deserial<unsigned_long>(a2a,pid_00,(unsigned_long *)((long)&pAVar2->offset + lVar4));
          this = local_40;
          deserial<unsigned_long>(a2a,pid_00,(unsigned_long *)((long)&pAVar2->size + lVar4));
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x38;
        } while (uVar5 < (this->m_counts).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6]);
        lVar3 = local_38 + uVar5;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < a2a->m_nprocs);
  }
  if (lVar3 != ((long)(this->m_actions).
                      super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_actions).
                      super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) {
    __assert_fail("i == m_actions.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                  ,0x13e,"void bsplib::Rdma::ActionBuf::deserialize(A2A &)");
  }
  return;
}

Assistant:

void Rdma::ActionBuf::deserialize( A2A & a2a ) 
{
    size_t n = 0;
    m_dummy_bsmp = true;
    for (int p = 0; p < a2a.nprocs(); ++p )
    {
        unsigned dummy;
        deserial( a2a, p, dummy );
        deserial( a2a, p, m_get_buffer_offset[ p ] );
        deserial( a2a, p, m_counts[ p ] );
        n += m_counts[p];
        m_dummy_bsmp = m_dummy_bsmp && dummy;
    }
    m_actions.resize( n );

    size_t i = 0;
    for (int p = 0; p < a2a.nprocs(); ++p )
    {
        for (size_t j = 0; j < m_counts[p]; ++j) {
            Action & a = m_actions[i++];
            a.target_pid = p;
            unsigned kind;
            deserial( a2a, p, kind );
            a.kind = Action::Kind(kind);
#ifdef PROFILE
            TicToc t( a.kind==Action::GET? TicToc::GET:
                  a.kind==Action::HPPUT? TicToc::HPPUT:
                  TicToc::HPGET );
#endif
            deserial( a2a, p, a.src_pid );
            deserial( a2a, p, a.dst_pid );
            deserial( a2a, p, a.tag );
            deserial( a2a, p, a.src_slot );
            deserial( a2a, p, a.dst_slot );
            deserial( a2a, p, a.offset );
            deserial( a2a, p, a.size );
        }
    }
    assert( i == m_actions.size() );
}